

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

int32_t array_container_read(int32_t cardinality,array_container_t *container,char *buf)

{
  if (container->capacity < cardinality) {
    array_container_grow(container,cardinality,false);
  }
  container->cardinality = cardinality;
  memcpy(container->array,buf,(long)cardinality * 2);
  return container->cardinality * 2;
}

Assistant:

int32_t array_container_read(int32_t cardinality, array_container_t *container,
                             const char *buf) {
    if (container->capacity < cardinality) {
        array_container_grow(container, cardinality, false);
    }
    container->cardinality = cardinality;
    memcpy(container->array, buf, container->cardinality * sizeof(uint16_t));

    return array_container_size_in_bytes(container);
}